

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void dwt_encode(opj_tcd_tilecomp_t *tilec)

{
  long lVar1;
  int x;
  int iVar2;
  int iVar3;
  int iVar4;
  int sn_00;
  int sn_01;
  int *piVar5;
  int *piVar6;
  int cas;
  int cas_00;
  int *in_RDI;
  int sn;
  int dn;
  int cas_row;
  int cas_col;
  int rh1;
  int rw1;
  int rh;
  int rw;
  int l;
  int w;
  int *bj;
  int *aj;
  int *a;
  int k;
  int j;
  int i;
  int local_14;
  int local_10;
  int local_c;
  
  x = in_RDI[2] - *in_RDI;
  iVar2 = in_RDI[4] + -1;
  lVar1 = *(long *)(in_RDI + 8);
  for (local_c = 0; local_c < iVar2; local_c = local_c + 1) {
    iVar3 = *(int *)(*(long *)(in_RDI + 6) + (long)(iVar2 - local_c) * 0x98 + 8) -
            *(int *)(*(long *)(in_RDI + 6) + (long)(iVar2 - local_c) * 0x98);
    iVar4 = *(int *)(*(long *)(in_RDI + 6) + (long)(iVar2 - local_c) * 0x98 + 0xc) -
            *(int *)(*(long *)(in_RDI + 6) + (long)(iVar2 - local_c) * 0x98 + 4);
    sn_00 = *(int *)(*(long *)(in_RDI + 6) + (long)((iVar2 - local_c) + -1) * 0x98 + 8) -
            *(int *)(*(long *)(in_RDI + 6) + (long)((iVar2 - local_c) + -1) * 0x98);
    sn_01 = *(int *)(*(long *)(in_RDI + 6) + (long)((iVar2 - local_c) + -1) * 0x98 + 0xc) -
            *(int *)(*(long *)(in_RDI + 6) + (long)((iVar2 - local_c) + -1) * 0x98 + 4);
    cas = *(int *)(*(long *)(in_RDI + 6) + (long)(iVar2 - local_c) * 0x98) % 2;
    cas_00 = *(int *)(*(long *)(in_RDI + 6) + (long)(iVar2 - local_c) * 0x98 + 4) % 2;
    piVar5 = (int *)malloc((long)iVar4 << 2);
    for (local_10 = 0; local_10 < iVar3; local_10 = local_10 + 1) {
      piVar6 = (int *)(lVar1 + (long)local_10 * 4);
      for (local_14 = 0; local_14 < iVar4; local_14 = local_14 + 1) {
        piVar5[local_14] = piVar6[local_14 * x];
      }
      dwt_encode_1(piVar5,iVar4 - sn_01,sn_01,cas_00);
      dwt_deinterleave_v(piVar5,piVar6,iVar4 - sn_01,sn_01,x,cas_00);
    }
    free(piVar5);
    piVar5 = (int *)malloc((long)iVar3 << 2);
    for (local_10 = 0; local_10 < iVar4; local_10 = local_10 + 1) {
      piVar6 = (int *)(lVar1 + (long)(local_10 * x) * 4);
      for (local_14 = 0; local_14 < iVar3; local_14 = local_14 + 1) {
        piVar5[local_14] = piVar6[local_14];
      }
      dwt_encode_1(piVar5,iVar3 - sn_00,sn_00,cas);
      dwt_deinterleave_h(piVar5,piVar6,iVar3 - sn_00,sn_00,cas);
    }
    free(piVar5);
  }
  return;
}

Assistant:

void dwt_encode(opj_tcd_tilecomp_t * tilec) {
	int i, j, k;
	int *a = NULL;
	int *aj = NULL;
	int *bj = NULL;
	int w, l;
	
	w = tilec->x1-tilec->x0;
	l = tilec->numresolutions-1;
	a = tilec->data;
	
	for (i = 0; i < l; i++) {
		int rw;			/* width of the resolution level computed                                                           */
		int rh;			/* height of the resolution level computed                                                          */
		int rw1;		/* width of the resolution level once lower than computed one                                       */
		int rh1;		/* height of the resolution level once lower than computed one                                      */
		int cas_col;	/* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
		int cas_row;	/* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
		int dn, sn;
		
		rw = tilec->resolutions[l - i].x1 - tilec->resolutions[l - i].x0;
		rh = tilec->resolutions[l - i].y1 - tilec->resolutions[l - i].y0;
		rw1= tilec->resolutions[l - i - 1].x1 - tilec->resolutions[l - i - 1].x0;
		rh1= tilec->resolutions[l - i - 1].y1 - tilec->resolutions[l - i - 1].y0;
		
		cas_row = tilec->resolutions[l - i].x0 % 2;
		cas_col = tilec->resolutions[l - i].y0 % 2;
        
		sn = rh1;
		dn = rh - rh1;
		bj = (int*)opj_malloc(rh * sizeof(int));
		for (j = 0; j < rw; j++) {
			aj = a + j;
			for (k = 0; k < rh; k++)  bj[k] = aj[k*w];
			dwt_encode_1(bj, dn, sn, cas_col);
			dwt_deinterleave_v(bj, aj, dn, sn, w, cas_col);
		}
		opj_free(bj);
		
		sn = rw1;
		dn = rw - rw1;
		bj = (int*)opj_malloc(rw * sizeof(int));
		for (j = 0; j < rh; j++) {
			aj = a + j * w;
			for (k = 0; k < rw; k++)  bj[k] = aj[k];
			dwt_encode_1(bj, dn, sn, cas_row);
			dwt_deinterleave_h(bj, aj, dn, sn, cas_row);
		}
		opj_free(bj);
	}
}